

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

int16_t __thiscall AmpIO::ReadDutyCycle(AmpIO *this,uint index)

{
  BasePort *pBVar1;
  uint32_t read_data;
  undefined4 local_c;
  
  local_c = 0;
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  if (pBVar1 == (BasePort *)0x0) {
    local_c._0_2_ = 0;
  }
  else {
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)(index * 0x10 + 0x10 | 0x900a),&local_c);
  }
  return (int16_t)local_c;
}

Assistant:

int16_t AmpIO::ReadDutyCycle(unsigned int index) const
{
    uint32_t read_data = 0;
    if (port)
        port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_DUTY_CYCLE, read_data);
    return static_cast<int16_t>(read_data);
}